

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O1

void __thiscall
gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
push<helics::ActionMessage&>
          (BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable> *this,
          ActionMessage *val)

{
  BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable> *this_00;
  bool bVar1;
  unique_lock<std::mutex> pushLock;
  unique_lock<std::mutex> pullLock;
  unique_lock<std::mutex> local_38;
  unique_lock<std::mutex> local_28;
  
  local_38._M_owns = false;
  local_38._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  this_00 = this + 0x50;
  if (*(long *)(this + 0x50) == *(long *)(this + 0x58)) {
    LOCK();
    bVar1 = this[0x80] ==
            (BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>)0x1;
    if (bVar1) {
      this[0x80] = (BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>)
                   0x0;
    }
    UNLOCK();
    if (bVar1) {
      std::unique_lock<std::mutex>::unlock(&local_38);
      local_28._M_device = (mutex_type *)(this + 0x28);
      local_28._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_28);
      local_28._M_owns = true;
      LOCK();
      this[0x80] = (BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>)
                   0x0;
      UNLOCK();
      if (*(long *)(this + 0x68) == *(long *)(this + 0x70)) {
        this_00 = this + 0x68;
      }
      else {
        std::unique_lock<std::mutex>::lock(&local_38);
      }
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)this_00,
                 val);
      std::condition_variable::notify_all();
      std::unique_lock<std::mutex>::~unique_lock(&local_28);
    }
    else {
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)this_00,
                 val);
      LOCK();
      bVar1 = this[0x80] ==
              (BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>)0x1;
      if (bVar1) {
        this[0x80] = (BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>
                      )0x0;
      }
      UNLOCK();
      if (bVar1) {
        std::condition_variable::notify_all();
      }
    }
  }
  else {
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
              ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)this_00,val)
    ;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return;
}

Assistant:

void push(Z&& val)  // forwarding reference
        {
            std::unique_lock<MUTEX> pushLock(
                m_pushLock);  // only one lock on this branch
            if (pushElements.empty()) {
                bool expEmpty = true;
                if (queueEmptyFlag.compare_exchange_strong(expEmpty, false)) {
                    // release the push lock so we don't get a potential
                    // deadlock condition
                    pushLock.unlock();
                    std::unique_lock<MUTEX> pullLock(
                        m_pullLock);  // first pullLock
                    queueEmptyFlag = false;
                    if (pullElements.empty()) {
                        pullElements.push_back(std::forward<Z>(val));
                        // pullLock.unlock ();
                    } else {
                        pushLock.lock();
                        pushElements.push_back(std::forward<Z>(val));
                    }
                    condition.notify_all();
                    return;
                } else {
                    pushElements.push_back(std::forward<Z>(val));
                    expEmpty = true;
                    if (queueEmptyFlag.compare_exchange_strong(
                            expEmpty, false)) {
                        condition.notify_all();
                    }
                    return;
                }
            }
            pushElements.push_back(std::forward<Z>(val));
        }